

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O0

void __thiscall xmrig::OclCnRunner::run(OclCnRunner *this,uint32_t nonce,uint32_t *hashOutput)

{
  bool bVar1;
  uint32_t uVar2;
  long lVar3;
  cl_command_queue queue;
  iterator worksize;
  reference ppCVar4;
  Cn1Kernel *this_00;
  void *in_RDX;
  undefined4 in_ESI;
  vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_> *in_RDI;
  cl_bool unaff_retaddr;
  CnBranchKernel *kernel;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_> *__range1;
  size_t i;
  size_t g_thd;
  size_t w_size;
  OclBaseRunner *in_stack_ffffffffffffffb0;
  __normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
  in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  pointer *threads;
  ulong __n;
  undefined4 in_stack_fffffffffffffff0;
  vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_> *offset;
  
  offset = in_RDI;
  lVar3 = (*(code *)(in_RDI->
                    super__Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[6])();
  uVar2 = OclThread::worksize((OclThread *)(lVar3 + 0x98));
  this_00 = (Cn1Kernel *)(ulong)uVar2;
  queue = (cl_command_queue)
          ((((long)this_00 +
            ((ulong)*(uint *)&in_RDI[3].
                              super__Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage - 1)) /
           (ulong)this_00) * (long)this_00);
  for (__n = 0; __n < 4; __n = __n + 1) {
    std::vector<_cl_mem_*,_std::allocator<_cl_mem_*>_>::operator[]
              ((vector<_cl_mem_*,_std::allocator<_cl_mem_*>_> *)
               &in_RDI[9].
                super__Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,__n);
    OclBaseRunner::enqueueWriteBuffer
              ((OclBaseRunner *)__end1._M_current,(cl_mem)kernel,unaff_retaddr,(size_t)offset,
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  }
  OclBaseRunner::enqueueWriteBuffer
            ((OclBaseRunner *)__end1._M_current,(cl_mem)kernel,unaff_retaddr,(size_t)offset,
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  Cn1Kernel::enqueue(this_00,queue,(uint32_t)(__n >> 0x20),in_stack_ffffffffffffffc8,
                     (size_t)in_stack_ffffffffffffffc0._M_current);
  Cn2Kernel::enqueue((Cn2Kernel *)this_00,queue,(uint32_t)(__n >> 0x20),in_stack_ffffffffffffffc8);
  threads = &in_RDI[10].
             super__Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  worksize = std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>::begin
                       (in_RDI);
  std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    ppCVar4 = __gnu_cxx::
              __normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
              ::operator*((__normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
                           *)&stack0xffffffffffffffc0);
    in_stack_ffffffffffffffb0 = (OclBaseRunner *)*ppCVar4;
    CnBranchKernel::enqueue
              ((CnBranchKernel *)this_00,queue,(uint32_t)(__n >> 0x20),(size_t)threads,
               (size_t)worksize._M_current);
    __gnu_cxx::
    __normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
    ::operator++((__normal_iterator<xmrig::CnBranchKernel_**,_std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>_>
                  *)&stack0xffffffffffffffc0);
  }
  OclBaseRunner::finalize(in_stack_ffffffffffffffb0,(uint32_t *)in_RDI);
  return;
}

Assistant:

void xmrig::OclCnRunner::run(uint32_t nonce, uint32_t *hashOutput)
{
    static const cl_uint zero = 0;

    const size_t w_size = data().thread.worksize();
    const size_t g_thd  = ((m_intensity + w_size - 1u) / w_size) * w_size;

    assert(g_thd % w_size == 0);

    for (size_t i = 0; i < BRANCH_MAX; ++i) {
        enqueueWriteBuffer(m_branches[i], CL_FALSE, sizeof(cl_uint) * m_intensity, sizeof(cl_uint), &zero);
    }

    enqueueWriteBuffer(m_output, CL_FALSE, sizeof(cl_uint) * 0xFF, sizeof(cl_uint), &zero);

    m_cn1->enqueue(m_queue, nonce, g_thd, w_size);
    m_cn2->enqueue(m_queue, nonce, g_thd);

    for (auto kernel : m_branchKernels) {
        kernel->enqueue(m_queue, nonce, g_thd, w_size);
    }

    finalize(hashOutput);
}